

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void sprintf<unsigned_char*>(stringstream *oss,string *fmt,uchar *value)

{
  ostream *poVar1;
  ostream *poVar2;
  byte bVar3;
  int iVar4;
  pointer pcVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  ostream oVar9;
  runtime_error *prVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  bool bVar17;
  undefined1 auVar18 [12];
  char local_68;
  undefined7 uStack_67;
  long local_58 [3];
  char *local_40;
  uchar *local_38;
  
  bVar17 = fmt->_M_string_length != 0;
  local_38 = value;
  if (bVar17) {
    poVar1 = (ostream *)(oss + 0x10);
    uVar16 = 0;
    do {
      pcVar5 = (fmt->_M_dataplus)._M_p;
      uVar13 = uVar16;
      if ((pcVar5[uVar16] == '%') && (uVar13 = uVar16 + 1, pcVar5[uVar16 + 1] != '%')) {
        uVar16 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar13);
        if (uVar16 <= uVar13) {
          bVar8 = false;
          uVar14 = uVar13;
          goto LAB_0011c9b9;
        }
        bVar8 = false;
        goto LAB_0011c8e2;
      }
      local_68 = pcVar5[uVar13];
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_68,1);
      uVar16 = uVar13 + 1;
      bVar17 = uVar16 < fmt->_M_string_length;
    } while (bVar17);
  }
  goto LAB_0011c881;
LAB_0011c8e2:
  do {
    bVar3 = (fmt->_M_dataplus)._M_p[uVar13];
    uVar14 = uVar13;
    if (bVar3 < 0x2b) {
      if (bVar3 != 0x20) {
        if (bVar3 != 0x23) break;
        bVar8 = true;
      }
    }
    else if (bVar3 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar3 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar3 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar2 = poVar1 + *(long *)(*(long *)poVar1 + -0x18);
        if (oss[*(long *)(*(long *)poVar1 + -0x18) + 0xf1] == (stringstream)0x0) {
          oVar9 = (ostream)std::ios::widen((char)poVar2);
          poVar2[0xe0] = oVar9;
          poVar2[0xe1] = (ostream)0x1;
        }
        poVar2[0xe0] = (ostream)0x30;
      }
    }
    uVar13 = uVar13 + 1;
    uVar14 = uVar16;
  } while (uVar16 != uVar13);
LAB_0011c9b9:
  std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
  pcVar7 = (char *)CONCAT71(uStack_67,local_68);
  piVar11 = __errno_location();
  iVar4 = *piVar11;
  *piVar11 = 0;
  lVar12 = strtol(pcVar7,&local_40,10);
  pcVar15 = local_40;
  if (local_40 == pcVar7) {
    std::__throw_invalid_argument("stoi");
LAB_0011cc10:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0011cc10;
    if (*piVar11 == 0) {
      *piVar11 = iVar4;
    }
    if ((long *)CONCAT71(uStack_67,local_68) != local_58) {
      operator_delete((long *)CONCAT71(uStack_67,local_68),local_58[0] + 1);
    }
    *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x20) = (long)(int)lVar12;
    pcVar15 = pcVar15 + (uVar14 - (long)pcVar7);
    if (pcVar15[(long)(fmt->_M_dataplus)._M_p] != '.') {
LAB_0011cb58:
      if ((byte)(pcVar15[(long)(fmt->_M_dataplus)._M_p] | 0x20U) == 0x78) {
        lVar12 = *(long *)(oss + 0x10);
        lVar6 = *(long *)(lVar12 + -0x18);
        *(uint *)(oss + lVar6 + 0x28) = *(uint *)(oss + lVar6 + 0x28) & 0xffffffb5 | 8;
        if (bVar8) {
          *(uint *)(oss + *(long *)(lVar12 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar12 + -0x18) + 0x28) | 0x200;
        }
      }
      streamout<unsigned_char*>(oss,local_38,0);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
      sprintf((char *)oss,&local_68);
      if ((long *)CONCAT71(uStack_67,local_68) != local_58) {
        operator_delete((long *)CONCAT71(uStack_67,local_68),local_58[0] + 1);
      }
      if (bVar17) {
        return;
      }
LAB_0011c881:
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"extra arguments provided to sprintf");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
    pcVar7 = (char *)CONCAT71(uStack_67,local_68);
    piVar11 = __errno_location();
    iVar4 = *piVar11;
    *piVar11 = 0;
    lVar12 = strtol(pcVar7,&local_40,10);
    if (local_40 != pcVar7) {
      if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0011cc28;
      if (*piVar11 == 0) {
        *piVar11 = iVar4;
      }
      if ((long *)CONCAT71(uStack_67,local_68) != local_58) {
        operator_delete((long *)CONCAT71(uStack_67,local_68),local_58[0] + 1);
      }
      *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x18) = (long)(int)lVar12;
      pcVar15 = local_40 + (long)(pcVar15 + (1 - (long)pcVar7));
      goto LAB_0011cb58;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0011cc28:
  auVar18 = std::__throw_out_of_range("stoi");
  if (auVar18._8_4_ != 1) {
    _Unwind_Resume(auVar18._0_8_);
  }
  __cxa_begin_catch(auVar18._0_8_);
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"Expected precision value in sprintf");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}